

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::FilePath_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string *path;
  long lVar1;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  string directory;
  string basename;
  FileDescriptor *file_local;
  string *output;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)(directory.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  path = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
  anon_unknown_0::PathSplit(path,(string *)local_60,(string *)((long)&directory.field_2 + 8));
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,"/"
                  );
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  StripProto(&local_b0,(string *)((long)&directory.field_2 + 8));
  std::__cxx11::string::operator=
            ((string *)(directory.field_2._M_local_buf + 8),(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  anon_unknown_0::UnderscoresToCamelCase
            (&local_d0,(string *)(directory.field_2._M_local_buf + 8),true);
  std::__cxx11::string::operator=
            ((string *)(directory.field_2._M_local_buf + 8),(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)(directory.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(directory.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string FilePath(const FileDescriptor* file) {
  string output;
  string basename;
  string directory;
  PathSplit(file->name(), &directory, &basename);
  if (directory.length() > 0) {
    output = directory + "/";
  }
  basename = StripProto(basename);

  // CamelCase to be more ObjC friendly.
  basename = UnderscoresToCamelCase(basename, true);

  output += basename;
  return output;
}